

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unicode_compare.hpp
# Opt level: O0

size_t jessilib::starts_with_length<char,char16_t>
                 (basic_string_view<char,_std::char_traits<char>_> in_string,
                 basic_string_view<char16_t,_std::char_traits<char16_t>_> in_prefix)

{
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_string_00;
  basic_string_view<char,_std::char_traits<char>_> in_string_01;
  bool bVar1;
  size_type __n;
  decode_result dVar2;
  decode_result dVar3;
  byte local_79;
  decode_result prefix_front;
  decode_result string_front;
  size_t codepoints_removed;
  basic_string_view<char16_t,_std::char_traits<char16_t>_> in_prefix_local;
  basic_string_view<char,_std::char_traits<char>_> in_string_local;
  
  in_prefix_local._M_str = (char16_t *)in_string._M_len;
  in_prefix_local._M_len = (size_t)in_prefix._M_str;
  codepoints_removed = in_prefix._M_len;
  string_front.units = 0;
  while( true ) {
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&in_prefix_local._M_str);
    local_79 = 0;
    if (!bVar1) {
      bVar1 = std::basic_string_view<char16_t,_std::char_traits<char16_t>_>::empty
                        ((basic_string_view<char16_t,_std::char_traits<char16_t>_> *)
                         &codepoints_removed);
      local_79 = bVar1 ^ 0xff;
    }
    if ((local_79 & 1) == 0) break;
    in_string_01._M_str = in_string._M_str;
    in_string_01._M_len = (size_t)in_prefix_local._M_str;
    dVar2 = decode_codepoint<char>(in_string_01);
    __n = dVar2.units;
    in_string_00._M_str = (char16_t *)in_prefix_local._M_len;
    in_string_00._M_len = codepoints_removed;
    dVar3 = decode_codepoint<char16_t>(in_string_00);
    if ((__n == 0) || (dVar3.units == 0)) {
      return 0;
    }
    if (dVar2.codepoint != dVar3.codepoint) {
      return 0;
    }
    std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
              ((basic_string_view<char,_std::char_traits<char>_> *)&in_prefix_local._M_str,__n);
    std::basic_string_view<char16_t,_std::char_traits<char16_t>_>::remove_prefix
              ((basic_string_view<char16_t,_std::char_traits<char16_t>_> *)&codepoints_removed,
               dVar3.units);
    string_front.units = __n + string_front.units;
  }
  bVar1 = std::basic_string_view<char16_t,_std::char_traits<char16_t>_>::empty
                    ((basic_string_view<char16_t,_std::char_traits<char16_t>_> *)&codepoints_removed
                    );
  if (!bVar1) {
    return 0;
  }
  return string_front.units;
}

Assistant:

size_t starts_with_length(std::basic_string_view<LhsCharT> in_string, std::basic_string_view<RhsCharT> in_prefix) {
	// If in_string and in_prefix are the same type, compare their sizes and quickly return if in_string is too small
	if constexpr (std::is_same_v<LhsCharT, RhsCharT>) {
		if (in_string.size() < in_prefix.size()) {
			return 0;
		}
	}

	size_t codepoints_removed{};
	while (!in_string.empty() && !in_prefix.empty()) {
		decode_result string_front = decode_codepoint(in_string);
		decode_result prefix_front = decode_codepoint(in_prefix);

		if (string_front.units == 0
			|| prefix_front.units == 0) {
			// Failed to decode front codepoint; bad unicode sequence
			return 0;
		}

		if (string_front.codepoint != prefix_front.codepoint) {
			// Codepoints aren't the same
			return 0;
		}

		// Codepoints are equal; trim off the fronts and continue
		in_string.remove_prefix(string_front.units);
		in_prefix.remove_prefix(prefix_front.units);
		codepoints_removed += string_front.units;
	}

	if (!in_prefix.empty()) {
		// We reached end of in_string before end of prefix
		return 0;
	}

	return codepoints_removed;
}